

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_tolower(char *dst,int dst_sz,char *str)

{
  char cVar1;
  long lVar2;
  
  for (lVar2 = 0; (cVar1 = str[lVar2], cVar1 != '\0' && (lVar2 < dst_sz + -1)); lVar2 = lVar2 + 1) {
    dst[lVar2] = ((byte)(cVar1 + 0xbfU) < 0x1a) * ' ' + cVar1;
  }
  dst[lVar2] = '\0';
  return dst;
}

Assistant:

char* sx_tolower(char* dst, int dst_sz, const char* str)
{
    int offset = 0;
    int dst_max = dst_sz - 1;
    while (*str && offset < dst_max) {
        dst[offset++] = sx_tolowerchar(*str);
        ++str;
    }
    dst[offset] = '\0';
    return dst;
}